

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall
icu_63::VTimeZone::writeZonePropsByDOW_GEQ_DOM_sub
          (VTimeZone *this,VTZWriter *writer,int32_t month,int32_t dayOfMonth,int32_t dayOfWeek,
          int32_t numDays,UDate untilTime,int32_t fromOffset,UErrorCode *status)

{
  UBool UVar1;
  UnicodeString *until;
  UErrorCode *pUVar2;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX;
  void *__buf_06;
  void *__buf_07;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  char *__filename;
  int local_88;
  int32_t i;
  undefined1 local_78 [8];
  UnicodeString dstr;
  UBool isFeb;
  int32_t startDayNum;
  UDate untilTime_local;
  int32_t numDays_local;
  int32_t dayOfWeek_local;
  int32_t dayOfMonth_local;
  int32_t month_local;
  VTZWriter *writer_local;
  VTimeZone *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return;
  }
  dstr.fUnion.fStackFields.fBuffer[0x18]._1_1_ = month == 1;
  dstr.fUnion._52_4_ = dayOfMonth;
  if ((dayOfMonth < 0) && (!(bool)dstr.fUnion.fStackFields.fBuffer[0x18]._1_1_)) {
    dstr.fUnion._52_4_ = *(int *)(MONTHLENGTH + (long)month * 4) + dayOfMonth + 1;
  }
  pUVar2 = status;
  beginRRULE(this,writer,month,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return;
  }
  VTZWriter::write(writer,0x4de226,__buf,(size_t)pUVar2);
  VTZWriter::write(writer,0x3d,__buf_00,(size_t)pUVar2);
  pUVar2 = (UErrorCode *)((long)(dayOfWeek + -1) * 3);
  VTZWriter::write(writer,(int)pUVar2 * 2 + 0x4de240,__buf_01,(size_t)pUVar2);
  VTZWriter::write(writer,0x3b,__buf_02,(size_t)pUVar2);
  VTZWriter::write(writer,0x4de210,__buf_03,(size_t)pUVar2);
  VTZWriter::write(writer,0x3d,__buf_04,(size_t)pUVar2);
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_78);
  appendAsciiDigits(dstr.fUnion._52_4_,'\0',(UnicodeString *)local_78);
  VTZWriter::write(writer,(int)local_78,__buf_05,(size_t)pUVar2);
  __buf_06 = extraout_RDX;
  for (local_88 = 1; local_88 < numDays; local_88 = local_88 + 1) {
    __filename = (char *)0x2c;
    VTZWriter::write(writer,0x2c,__buf_06,(size_t)pUVar2);
    icu_63::UnicodeString::remove((UnicodeString *)local_78,__filename);
    appendAsciiDigits(dstr.fUnion._52_4_ + local_88,'\0',(UnicodeString *)local_78);
    VTZWriter::write(writer,(int)local_78,__buf_07,(size_t)pUVar2);
    __buf_06 = extraout_RDX_00;
  }
  if ((untilTime != 1.838821689216e+17) || (NAN(untilTime))) {
    until = getDateTimeString(untilTime + (double)fromOffset,(UnicodeString *)local_78);
    pUVar2 = status;
    appendUNTIL(this,writer,until,status);
    UVar1 = ::U_FAILURE(*status);
    __buf_06 = extraout_RDX_01;
    if (UVar1 != '\0') goto LAB_0030d8cc;
  }
  VTZWriter::write(writer,0x4de19e,__buf_06,(size_t)pUVar2);
LAB_0030d8cc:
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_78);
  return;
}

Assistant:

void
VTimeZone::writeZonePropsByDOW_GEQ_DOM_sub(VTZWriter& writer, int32_t month, int32_t dayOfMonth,
                                           int32_t dayOfWeek, int32_t numDays,
                                           UDate untilTime, int32_t fromOffset, UErrorCode& status) const {

    if (U_FAILURE(status)) {
        return;
    }
    int32_t startDayNum = dayOfMonth;
    UBool isFeb = (month == UCAL_FEBRUARY);
    if (dayOfMonth < 0 && !isFeb) {
        // Use positive number if possible
        startDayNum = MONTHLENGTH[month] + dayOfMonth + 1;
    }
    beginRRULE(writer, month, status);
    if (U_FAILURE(status)) {
        return;
    }
    writer.write(ICAL_BYDAY);
    writer.write(EQUALS_SIGN);
    writer.write(ICAL_DOW_NAMES[dayOfWeek - 1]);    // SU, MO, TU...
    writer.write(SEMICOLON);
    writer.write(ICAL_BYMONTHDAY);
    writer.write(EQUALS_SIGN);

    UnicodeString dstr;
    appendAsciiDigits(startDayNum, 0, dstr);
    writer.write(dstr);
    for (int32_t i = 1; i < numDays; i++) {
        writer.write(COMMA);
        dstr.remove();
        appendAsciiDigits(startDayNum + i, 0, dstr);
        writer.write(dstr);
    }

    if (untilTime != MAX_MILLIS) {
        appendUNTIL(writer, getDateTimeString(untilTime + fromOffset, dstr), status);
        if (U_FAILURE(status)) {
            return;
        }
    }
    writer.write(ICAL_NEWLINE);
}